

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O3

void __thiscall CDesign::CreateNet(CDesign *this,int iNumNet)

{
  CNet **__src;
  CNet **__dest;
  ulong uVar1;
  
  this->m_iNumNet = iNumNet;
  __src = this->m_ppNet;
  if (__src == (CNet **)0x0) {
    if (iNumNet == 0) {
      __assert_fail("m_iNumNet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x44e,"void CDesign::CreateNet(int)");
    }
    uVar1 = 0xffffffffffffffff;
    if (-1 < iNumNet) {
      uVar1 = (ulong)(uint)iNumNet << 3;
    }
    __dest = (CNet **)operator_new__(uVar1);
  }
  else {
    uVar1 = 0xffffffffffffffff;
    if (-1 < iNumNet) {
      uVar1 = (long)iNumNet << 3;
    }
    __dest = (CNet **)operator_new__(uVar1);
    memcpy(__dest,__src,(long)iNumNet << 3);
    operator_delete__(__src);
  }
  this->m_ppNet = __dest;
  return;
}

Assistant:

void CDesign::CreateNet(int	iNumNet)
{
	m_iNumNet	=	iNumNet;

	if(m_ppNet)
	{
		// save some memory by removing local nets [2/13/2007 thyeros]
		CNet**	ppNet	=	new	CNet*[m_iNumNet];
		memcpy(ppNet,m_ppNet,sizeof(CNet*)*m_iNumNet);
		SAFE_DELA(m_ppNet);
		m_ppNet	=	ppNet;
	}
	else
	{
		//initialize the memory for nets
		assert(m_iNumNet);
		m_ppNet	=	new	CNet*[m_iNumNet];
		assert(m_ppNet);
	}
}